

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TableSetupColumn
               (char *label,ImGuiTableColumnFlags flags,float init_width_or_weight,ImGuiID user_id)

{
  int iVar1;
  ImGuiTable *table;
  char cVar2;
  short sVar3;
  uint uVar4;
  ImGuiTableColumn *pIVar5;
  size_t sVar6;
  float fVar7;
  
  table = GImGui->CurrentTable;
  if (table == (ImGuiTable *)0x0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x2479,"TableSetupColumn","ImGui ASSERT FAILED: %s",
                "table != NULL && \"Need to call TableSetupColumn() after BeginTable()!\"");
  }
  if (table->IsLayoutLocked == true) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x247a,"TableSetupColumn","ImGui ASSERT FAILED: %s",
                "!table->IsLayoutLocked && \"Need to call call TableSetupColumn() before first row!\""
               );
  }
  cVar2 = table->DeclColumnsCount;
  if ((cVar2 < 0) || (table->ColumnsCount <= (int)cVar2)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x247b,"TableSetupColumn","ImGui ASSERT FAILED: %s",
                "table->DeclColumnsCount >= 0 && table->DeclColumnsCount < table->ColumnsCount && \"Called TableSetupColumn() too many times!\""
               );
    cVar2 = table->DeclColumnsCount;
  }
  pIVar5 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,(int)cVar2);
  table->DeclColumnsCount = table->DeclColumnsCount + '\x01';
  if ((flags & 0x1cU) == 0) {
    uVar4 = flags | 4;
    if ((table->Flags & 0x8000) == 0) {
      uVar4 = flags;
    }
    if (0.0 < init_width_or_weight) {
      flags = uVar4;
    }
  }
  pIVar5->UserID = user_id;
  pIVar5->FlagsIn = flags;
  uVar4 = TableFixColumnFlags(table,flags);
  pIVar5->Flags = uVar4;
  if ((uVar4 & 8) == 0) {
    fVar7 = 1.0;
  }
  else {
    if ((init_width_or_weight == 0.0) && (!NAN(init_width_or_weight))) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                  ,0x248f,"TableSetupColumn","ImGui ASSERT FAILED: %s",
                  "init_width_or_weight != 0.0f && \"Need to provide a valid weight!\"");
    }
    fVar7 = init_width_or_weight;
    if (init_width_or_weight < 0.0) {
      fVar7 = 1.0;
      init_width_or_weight = 1.0;
    }
  }
  pIVar5->WidthOrWeightInitValue = init_width_or_weight;
  if (table->IsInitializing == true) {
    if ((pIVar5->WidthRequest <= 0.0 && pIVar5->WidthRequest != 0.0) &&
       (pIVar5->WidthStretchWeight <= 0.0 && pIVar5->WidthStretchWeight != 0.0)) {
      if (((uVar4 & 4) != 0) && (0.0 < init_width_or_weight)) {
        pIVar5->WidthRequest = init_width_or_weight;
        pIVar5->AutoFitQueue = '\0';
      }
      pIVar5->WidthStretchWeight = fVar7;
    }
    if (((uVar4 & 1) != 0) && ((table->SettingsLoadedFlags & 4) == 0)) {
      pIVar5->IsVisible = false;
      pIVar5->IsVisibleNextFrame = false;
    }
    if (((uVar4 & 2) != 0) && ((table->SettingsLoadedFlags & 8) == 0)) {
      pIVar5->SortOrder = '\0';
      pIVar5->SortDirection = (((uint)pIVar5->Flags >> 0xd & 1) != 0) + '\x01';
    }
  }
  if (pIVar5->NameOffset != -1) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x24af,"TableSetupColumn","ImGui ASSERT FAILED: %s","column->NameOffset == -1");
  }
  if (label != (char *)0x0) {
    iVar1 = (table->ColumnsNames).Buf.Size;
    sVar3 = (short)iVar1 + -1;
    if (iVar1 == 0) {
      sVar3 = 0;
    }
    pIVar5->NameOffset = sVar3;
    sVar6 = strlen(label);
    ImGuiTextBuffer::append(&table->ColumnsNames,label,label + sVar6 + 1);
    return;
  }
  return;
}

Assistant:

void    ImGui::TableSetupColumn(const char* label, ImGuiTableColumnFlags flags, float init_width_or_weight, ImGuiID user_id)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Need to call TableSetupColumn() after BeginTable()!");
    IM_ASSERT(!table->IsLayoutLocked && "Need to call call TableSetupColumn() before first row!");
    IM_ASSERT(table->DeclColumnsCount >= 0 && table->DeclColumnsCount < table->ColumnsCount && "Called TableSetupColumn() too many times!");

    ImGuiTableColumn* column = &table->Columns[table->DeclColumnsCount];
    table->DeclColumnsCount++;

    // When passing a width automatically enforce WidthFixed policy
    // (vs TableFixColumnFlags would default to WidthAlwaysAutoResize)
    // (we write to FlagsIn which is a little misleading, another solution would be to pass init_width_or_weight to TableFixColumnFlags)
    if ((flags & ImGuiTableColumnFlags_WidthMask_) == 0)
        if ((table->Flags & ImGuiTableFlags_SizingPolicyFixedX) && (init_width_or_weight > 0.0f))
            flags |= ImGuiTableColumnFlags_WidthFixed;

    column->UserID = user_id;
    column->FlagsIn = flags;
    column->Flags = TableFixColumnFlags(table, column->FlagsIn);
    flags = column->Flags;

    // Initialize defaults
    if (flags & ImGuiTableColumnFlags_WidthStretch)
    {
        IM_ASSERT(init_width_or_weight != 0.0f && "Need to provide a valid weight!");
        if (init_width_or_weight < 0.0f)
            init_width_or_weight = 1.0f;
    }
    column->WidthOrWeightInitValue = init_width_or_weight;
    if (table->IsInitializing && column->WidthRequest < 0.0f && column->WidthStretchWeight < 0.0f)
    {
        // Init width or weight
        if ((flags & ImGuiTableColumnFlags_WidthFixed) && init_width_or_weight > 0.0f)
        {
            // Disable auto-fit if a default fixed width has been specified
            column->WidthRequest = init_width_or_weight;
            column->AutoFitQueue = 0x00;
        }
        if (flags & ImGuiTableColumnFlags_WidthStretch)
            column->WidthStretchWeight = init_width_or_weight;
        else
            column->WidthStretchWeight = 1.0f;
    }
    if (table->IsInitializing)
    {
        // Init default visibility/sort state
        if ((flags & ImGuiTableColumnFlags_DefaultHide) && (table->SettingsLoadedFlags & ImGuiTableFlags_Hideable) == 0)
            column->IsVisible = column->IsVisibleNextFrame = false;
        if (flags & ImGuiTableColumnFlags_DefaultSort && (table->SettingsLoadedFlags & ImGuiTableFlags_Sortable) == 0)
        {
            column->SortOrder = 0; // Multiple columns using _DefaultSort will be reordered when building the sort specs.
            column->SortDirection = (column->Flags & ImGuiTableColumnFlags_PreferSortDescending) ? (ImS8)ImGuiSortDirection_Descending : (ImU8)(ImGuiSortDirection_Ascending);
        }
    }

    // Store name (append with zero-terminator in contiguous buffer)
    IM_ASSERT(column->NameOffset == -1);
    if (label != NULL)
    {
        column->NameOffset = (ImS16)table->ColumnsNames.size();
        table->ColumnsNames.append(label, label + strlen(label) + 1);
    }
}